

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int emit_class_init_start(JSParseState *s,ClassFieldsDef *cf)

{
  int iVar1;
  JSFunctionDef *pJVar2;
  long *in_RSI;
  JSParseState *in_RDI;
  int label_add_brand;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  uint16_t in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  uint8_t val;
  int local_4;
  
  pJVar2 = js_parse_function_class_fields_init
                     ((JSParseState *)
                      CONCAT26(in_stack_ffffffffffffffde,
                               CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
  *in_RSI = (long)pJVar2;
  if (*in_RSI == 0) {
    local_4 = -1;
  }
  else {
    in_RDI->cur_func = (JSFunctionDef *)*in_RSI;
    emit_op(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38));
    *(undefined4 *)(in_RSI + 2) = *(undefined4 *)(*in_RSI + 0x160);
    iVar1 = emit_goto((JSParseState *)
                      CONCAT26(in_stack_ffffffffffffffde,
                               CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0,
                      0x19a7c5);
    val = (uint8_t)((ulong)in_RSI >> 0x38);
    emit_op(in_RDI,val);
    emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
              CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
    emit_u16((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde);
    emit_op(in_RDI,val);
    emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
              CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
    emit_u16((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde);
    emit_op(in_RDI,val);
    emit_label((JSParseState *)
               CONCAT26(in_stack_ffffffffffffffde,
                        CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0);
    in_RDI->cur_func = in_RDI->cur_func->parent;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static __exception int emit_class_init_start(JSParseState *s,
                                             ClassFieldsDef *cf)
{
    int label_add_brand;
    
    cf->fields_init_fd = js_parse_function_class_fields_init(s);
    if (!cf->fields_init_fd)
        return -1;

    s->cur_func = cf->fields_init_fd;
    
    /* XXX: would be better to add the code only if needed, maybe in a
       later pass */
    emit_op(s, OP_push_false); /* will be patched later */
    cf->brand_push_pos = cf->fields_init_fd->last_opcode_pos;
    label_add_brand = emit_goto(s, OP_if_false, -1);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_this);
    emit_u16(s, 0);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_home_object);
    emit_u16(s, 0);
    
    emit_op(s, OP_add_brand);
    
    emit_label(s, label_add_brand);

    s->cur_func = s->cur_func->parent;
    return 0;
}